

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

PointerType __thiscall
cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->(iterator *this)

{
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *pcVar1;
  pointer pBVar2;
  ulong uVar3;
  ulong uVar4;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmLinkedTree.h"
                  ,0x53,
                  "PointerType cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->() [T = cmState::BuildsystemDirectoryStateType]"
                 );
  }
  pBVar2 = (pcVar1->Data).
           super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(pcVar1->Data).
                 super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 4) *
          0x2e8ba2e8ba2e8ba3;
  if ((long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 != uVar4) {
    __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmLinkedTree.h"
                  ,0x54,
                  "PointerType cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->() [T = cmState::BuildsystemDirectoryStateType]"
                 );
  }
  uVar3 = this->Position;
  if (uVar4 < uVar3) {
    __assert_fail("this->Position <= this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmLinkedTree.h"
                  ,0x55,
                  "PointerType cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->() [T = cmState::BuildsystemDirectoryStateType]"
                 );
  }
  if (uVar3 != 0) {
    return pBVar2 + uVar3 + 0xffffffffffffffff;
  }
  __assert_fail("this->Position > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmLinkedTree.h"
                ,0x56,
                "PointerType cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->() [T = cmState::BuildsystemDirectoryStateType]"
               );
}

Assistant:

PointerType operator->()
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      return this->Tree->GetPointer(this->Position - 1);
    }